

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O1

void __thiscall
GdlRenderer::RecordSingleMemberClasses
          (GdlRenderer *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *vstaSingleMemberClasses,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *vstaFiles,vector<int,_std::allocator<int>_> *vnLines,string *staPathToCur)

{
  GdlGlyphClassDefn *this_00;
  pointer pcVar1;
  pointer ppGVar2;
  ulong uVar3;
  string local_50;
  
  ppGVar2 = (this->m_vpglfc).
            super__Vector_base<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_vpglfc).super__Vector_base<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppGVar2) {
    uVar3 = 0;
    do {
      this_00 = ppGVar2[uVar3];
      pcVar1 = (staPathToCur->_M_dataplus)._M_p;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar1,pcVar1 + staPathToCur->_M_string_length);
      GdlGlyphClassDefn::RecordSingleMemberClasses
                (this_00,vstaSingleMemberClasses,vstaFiles,vnLines,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      uVar3 = uVar3 + 1;
      ppGVar2 = (this->m_vpglfc).
                super__Vector_base<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar3 < (ulong)((long)(this->m_vpglfc).
                                   super__Vector_base<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppGVar2 >> 3))
    ;
  }
  return;
}

Assistant:

void GdlRenderer::RecordSingleMemberClasses(std::vector<std::string> & vstaSingleMemberClasses,
	std::vector<std::string> & vstaFiles, std::vector<int> & vnLines, std::string staPathToCur)
{
	for (size_t ipglfc = 0; ipglfc < m_vpglfc.size(); ipglfc++)
	{
		m_vpglfc[ipglfc]->RecordSingleMemberClasses(vstaSingleMemberClasses, vstaFiles, vnLines,
			staPathToCur);
	}
}